

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

FlattenTo2DLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_flattento2d(NeuralNetworkLayer *this)

{
  ulong uVar1;
  FlattenTo2DLayerParams *pFVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x46a) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x46a;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pFVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::FlattenTo2DLayerParams>(arena);
    (this->layer_).flattento2d_ = pFVar2;
  }
  return (FlattenTo2DLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::FlattenTo2DLayerParams* NeuralNetworkLayer::_internal_mutable_flattento2d() {
  if (!_internal_has_flattento2d()) {
    clear_layer();
    set_has_flattento2d();
    layer_.flattento2d_ = CreateMaybeMessage< ::CoreML::Specification::FlattenTo2DLayerParams >(GetArenaForAllocation());
  }
  return layer_.flattento2d_;
}